

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_extract.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::UnionExtractBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  bool bVar2;
  __type_conflict8 _Var3;
  pointer pEVar4;
  ParameterNotResolvedException *pPVar5;
  BinderException *pBVar6;
  InternalException *this;
  ulong uVar7;
  type pEVar8;
  string *msg;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  closest_settings;
  idx_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  candidates;
  string *member_name;
  size_t i;
  bool found_key;
  idx_t key_index;
  LogicalType return_type;
  string key;
  string *key_str;
  Value key_val;
  value_type *key_child;
  idx_t union_member_count;
  unique_ptr<duckdb::UnionExtractBindData,_std::default_delete<duckdb::UnionExtractBindData>_>
  *in_stack_fffffffffffffc68;
  LogicalType *in_stack_fffffffffffffc70;
  value_type *in_stack_fffffffffffffc78;
  allocator *paVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  size_type in_stack_fffffffffffffc98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  LogicalType *in_stack_fffffffffffffcd8;
  unsigned_long *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  BinderException *in_stack_fffffffffffffd10;
  string local_288 [32];
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [24];
  ulong local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  string local_1a0 [32];
  undefined8 local_180;
  ulong local_178;
  byte local_169;
  ulong local_168;
  LogicalType local_160 [24];
  string local_148 [38];
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  string *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [2];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  reference local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  ulong local_60;
  undefined1 local_52;
  allocator local_51;
  string local_50 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffc70);
  LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar1 == UNKNOWN) {
    pPVar5 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(pPVar5);
    __cxa_throw(pPVar5,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffc70);
  LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar1 != UNION) {
    local_52 = 1;
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"union_extract can only take a union parameter",&local_51)
    ;
    duckdb::BinderException::BinderException(pBVar6,local_50);
    local_52 = 0;
    __cxa_throw(pBVar6,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffc70);
  local_60 = duckdb::UnionType::GetMemberCount((LogicalType *)(pEVar4 + 0x38));
  if (local_60 == 0) {
    local_82 = 1;
    this = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Can\'t extract something from an empty union",&local_81);
    duckdb::InternalException::InternalException(this,local_80);
    local_82 = 0;
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffc70);
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc70,
             (size_type)in_stack_fffffffffffffc68);
  LogicalType::operator=((LogicalType *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  local_90 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffc70);
  uVar7 = (**(code **)(*(long *)pEVar4 + 0x30))();
  if ((uVar7 & 1) != 0) {
    pPVar5 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(pPVar5);
    __cxa_throw(pPVar5,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffc70);
  LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar1 == VARCHAR) {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffc70);
    uVar7 = (**(code **)(*(long *)pEVar4 + 0x78))();
    if ((uVar7 & 1) != 0) {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_fffffffffffffc70);
      params = local_f8;
      duckdb::ExpressionExecutor::EvaluateScalar
                ((ClientContext *)params,(Expression *)local_10,SUB81(pEVar8,0));
      msg = (string *)duckdb::StringValue::Get_abi_cxx11_((Value *)params);
      local_100 = msg;
      bVar2 = Value::IsNull((Value *)local_f8);
      if (!bVar2) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          duckdb::StringUtil::Lower(local_148);
          duckdb::LogicalType::LogicalType(local_160);
          local_168 = 0;
          local_169 = 0;
          local_178 = 0;
          params_1 = local_10;
          do {
            if (local_60 <= local_178) {
LAB_00f25b65:
              if ((local_169 & 1) == 0) {
                this_00 = &local_1b8;
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)0xf25b85);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve(this_00,in_stack_fffffffffffffc98);
                for (local_1c0 = 0; local_1c0 < local_60; local_1c0 = local_1c0 + 1) {
                  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
                  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                         *)in_stack_fffffffffffffc70);
                  duckdb::UnionType::GetMemberName_abi_cxx11_
                            ((LogicalType *)(pEVar4 + 0x38),local_1c0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
                }
                duckdb::StringUtil::TopNJaroWinkler
                          (local_1d8,(string *)&local_1b8,(ulong)local_148,0.5);
                paVar10 = &local_219;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_218,"Candidate Entries",paVar10);
                duckdb::StringUtil::CandidatesMessage(local_1f8,local_1d8);
                std::__cxx11::string::~string(local_218);
                std::allocator<char>::~allocator((allocator<char> *)&local_219);
                uVar9 = __cxa_allocate_exception(0x10);
                paVar10 = &local_241;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_240,"Could not find key \"%s\" in union\n%s",paVar10);
                std::__cxx11::string::string(local_268,local_148);
                std::__cxx11::string::string(local_288,local_1f8);
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (in_stack_fffffffffffffd10,msg,params,params_1);
                __cxa_throw(uVar9,&BinderException::typeinfo,BinderException::~BinderException);
              }
              LogicalType::operator=
                        ((LogicalType *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
              make_uniq<duckdb::UnionExtractBindData,std::__cxx11::string&,unsigned_long&,duckdb::LogicalType&>
                        (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffcd8);
              unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
              unique_ptr<duckdb::UnionExtractBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                        ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                          *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
              unique_ptr<duckdb::UnionExtractBindData,_std::default_delete<duckdb::UnionExtractBindData>,_true>
              ::~unique_ptr((unique_ptr<duckdb::UnionExtractBindData,_std::default_delete<duckdb::UnionExtractBindData>,_true>
                             *)0xf25f12);
              duckdb::LogicalType::~LogicalType(local_160);
              std::__cxx11::string::~string(local_148);
              duckdb::Value::~Value((Value *)local_f8);
              return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                     (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                      )in_RDI._M_t.
                       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                       .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
            }
            in_stack_fffffffffffffcd8 =
                 (LogicalType *)
                 vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
            pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)in_stack_fffffffffffffc70);
            local_180 = duckdb::UnionType::GetMemberName_abi_cxx11_
                                  ((LogicalType *)(pEVar4 + 0x38),local_178);
            duckdb::StringUtil::Lower(local_1a0);
            _Var3 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            std::__cxx11::string::~string(local_1a0);
            if (_Var3) {
              local_169 = 1;
              local_168 = local_178;
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
              pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                     *)in_stack_fffffffffffffc70);
              duckdb::UnionType::GetMemberType((LogicalType *)(pEVar4 + 0x38),local_178);
              LogicalType::operator=
                        ((LogicalType *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
              goto LAB_00f25b65;
            }
            local_178 = local_178 + 1;
          } while( true );
        }
      }
      local_122 = 1;
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      paVar10 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_120,"Key name for union_extract needs to be neither NULL nor empty",paVar10);
      duckdb::BinderException::BinderException(pBVar6,local_120);
      local_122 = 0;
      __cxa_throw(pBVar6,&BinderException::typeinfo,BinderException::~BinderException);
    }
  }
  local_b2 = 1;
  pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,"Key name for union_extract needs to be a constant string",&local_b1);
  duckdb::BinderException::BinderException(pBVar6,local_b0);
  local_b2 = 0;
  __cxa_throw(pBVar6,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

static unique_ptr<FunctionData> UnionExtractBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);
	if (arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (arguments[0]->return_type.id() != LogicalTypeId::UNION) {
		throw BinderException("union_extract can only take a union parameter");
	}
	idx_t union_member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (union_member_count == 0) {
		throw InternalException("Can't extract something from an empty union");
	}
	bound_function.arguments[0] = arguments[0]->return_type;

	auto &key_child = arguments[1];
	if (key_child->HasParameter()) {
		throw ParameterNotResolvedException();
	}

	if (key_child->return_type.id() != LogicalTypeId::VARCHAR || !key_child->IsFoldable()) {
		throw BinderException("Key name for union_extract needs to be a constant string");
	}
	Value key_val = ExpressionExecutor::EvaluateScalar(context, *key_child);
	D_ASSERT(key_val.type().id() == LogicalTypeId::VARCHAR);
	auto &key_str = StringValue::Get(key_val);
	if (key_val.IsNull() || key_str.empty()) {
		throw BinderException("Key name for union_extract needs to be neither NULL nor empty");
	}
	string key = StringUtil::Lower(key_str);

	LogicalType return_type;
	idx_t key_index = 0;
	bool found_key = false;

	for (size_t i = 0; i < union_member_count; i++) {
		auto &member_name = UnionType::GetMemberName(arguments[0]->return_type, i);
		if (StringUtil::Lower(member_name) == key) {
			found_key = true;
			key_index = i;
			return_type = UnionType::GetMemberType(arguments[0]->return_type, i);
			break;
		}
	}

	if (!found_key) {
		vector<string> candidates;
		candidates.reserve(union_member_count);
		for (idx_t i = 0; i < union_member_count; i++) {
			candidates.push_back(UnionType::GetMemberName(arguments[0]->return_type, i));
		}
		auto closest_settings = StringUtil::TopNJaroWinkler(candidates, key);
		auto message = StringUtil::CandidatesMessage(closest_settings, "Candidate Entries");
		throw BinderException("Could not find key \"%s\" in union\n%s", key, message);
	}

	bound_function.return_type = return_type;
	return make_uniq<UnionExtractBindData>(key, key_index, return_type);
}